

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

bool __thiscall BuildLog::Recompact(BuildLog *this,string *path,BuildLogUser *user,string *err)

{
  Metrics *this_00;
  string *psVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Metric *pMVar5;
  char *pcVar6;
  FILE *__stream;
  int *piVar7;
  pointer ppVar8;
  size_type sVar9;
  reference __x;
  char *__new;
  Metric *local_118;
  ulong local_f0;
  size_t i_1;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_d0;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_c8;
  iterator i;
  vector<StringPiece,_std::allocator<StringPiece>_> dead_outputs;
  FILE *f;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  BuildLogUser *user_local;
  string *path_local;
  BuildLog *this_local;
  
  local_30 = err;
  err_local = (string *)user;
  user_local = (BuildLogUser *)path;
  path_local = (string *)this;
  if ((Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)::
       metrics_h_metric == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_118 = (Metric *)0x0;
      Recompact::metrics_h_metric = local_118;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,".ninja_log recompact",&local_51);
      pMVar5 = Metrics::NewMetric(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      Recompact::metrics_h_metric = pMVar5;
    }
    __cxa_guard_release(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric
            ((ScopedMetric *)((long)&temp_path.field_2 + 8),Recompact::metrics_h_metric);
  Close(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)user_local,
                 ".recompact");
  pcVar6 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar6,"wb");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    pcVar6 = strerror(*piVar7);
    std::__cxx11::string::operator=((string *)local_30,pcVar6);
    this_local._7_1_ = 0;
  }
  else {
    iVar4 = fprintf(__stream,"# ninja log v%d\n",5);
    if (iVar4 < 0) {
      piVar7 = __errno_location();
      pcVar6 = strerror(*piVar7);
      std::__cxx11::string::operator=((string *)local_30,pcVar6);
      fclose(__stream);
      this_local._7_1_ = 0;
    }
    else {
      std::vector<StringPiece,_std::allocator<StringPiece>_>::vector
                ((vector<StringPiece,_std::allocator<StringPiece>_> *)&i);
      local_c8._M_cur =
           (__node_type *)
           std::
           unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
           ::begin(&this->entries_);
      while( true ) {
        local_d0._M_cur =
             (__node_type *)
             std::
             unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
             ::end(&this->entries_);
        bVar2 = std::__detail::operator!=(&local_c8,&local_d0);
        psVar1 = err_local;
        if (!bVar2) break;
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                             *)&local_c8);
        bVar3 = (*(code *)**(undefined8 **)psVar1)(psVar1,(ppVar8->first).str_,(ppVar8->first).len_)
        ;
        if ((bVar3 & 1) == 0) {
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                               *)&local_c8);
          bVar2 = WriteEntry(this,(FILE *)__stream,ppVar8->second);
          if (!bVar2) {
            piVar7 = __errno_location();
            pcVar6 = strerror(*piVar7);
            std::__cxx11::string::operator=((string *)local_30,pcVar6);
            fclose(__stream);
            this_local._7_1_ = 0;
            goto LAB_00107895;
          }
        }
        else {
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                               *)&local_c8);
          std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back
                    ((vector<StringPiece,_std::allocator<StringPiece>_> *)&i,&ppVar8->first);
        }
        std::__detail::
        _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::operator++
                  ((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                    *)&local_c8);
      }
      for (local_f0 = 0;
          sVar9 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                            ((vector<StringPiece,_std::allocator<StringPiece>_> *)&i),
          local_f0 < sVar9; local_f0 = local_f0 + 1) {
        __x = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                        ((vector<StringPiece,_std::allocator<StringPiece>_> *)&i,local_f0);
        std::
        unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
        ::erase(&this->entries_,__x);
      }
      fclose(__stream);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar4 = unlink(pcVar6);
      if (iVar4 < 0) {
        piVar7 = __errno_location();
        pcVar6 = strerror(*piVar7);
        std::__cxx11::string::operator=((string *)local_30,pcVar6);
        this_local._7_1_ = 0;
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        __new = (char *)std::__cxx11::string::c_str();
        iVar4 = rename(pcVar6,__new);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          pcVar6 = strerror(*piVar7);
          std::__cxx11::string::operator=((string *)local_30,pcVar6);
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
LAB_00107895:
      std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
                ((vector<StringPiece,_std::allocator<StringPiece>_> *)&i);
    }
  }
  std::__cxx11::string::~string((string *)&f);
  ScopedMetric::~ScopedMetric((ScopedMetric *)((long)&temp_path.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BuildLog::Recompact(const string& path, const BuildLogUser& user,
                         string* err) {
  METRIC_RECORD(".ninja_log recompact");

  Close();
  string temp_path = path + ".recompact";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }

  vector<StringPiece> dead_outputs;
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    if (user.IsPathDead(i->first)) {
      dead_outputs.push_back(i->first);
      continue;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  for (size_t i = 0; i < dead_outputs.size(); ++i)
    entries_.erase(dead_outputs[i]);

  fclose(f);
  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}